

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_open_memory.c
# Opt level: O2

int memory_write_open(archive *a,void *client_data)

{
  int iVar1;
  
  *(undefined8 *)client_data = 0;
  if (*(undefined8 **)((long)client_data + 0x10) != (undefined8 *)0x0) {
    **(undefined8 **)((long)client_data + 0x10) = 0;
  }
  iVar1 = archive_write_get_bytes_in_last_block(a);
  if (iVar1 == -1) {
    archive_write_set_bytes_in_last_block(a,1);
  }
  return 0;
}

Assistant:

static int
memory_write_open(struct archive *a, void *client_data)
{
	struct write_memory_data *mine;
	mine = client_data;
	mine->used = 0;
	if (mine->client_size != NULL)
		*mine->client_size = mine->used;
	/* Disable padding if it hasn't been set explicitly. */
	if (-1 == archive_write_get_bytes_in_last_block(a))
		archive_write_set_bytes_in_last_block(a, 1);
	return (ARCHIVE_OK);
}